

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::FunctionStabilityToValue(Value *__return_storage_ptr__,FunctionStability stability)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  if (stability < (CONSISTENT_WITHIN_QUERY|VOLATILE)) {
    Value::Value(__return_storage_ptr__,
                 &DAT_020248ec + *(int *)(&DAT_020248ec + (ulong)stability * 4));
    return __return_storage_ptr__;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Unsupported FunctionStability",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Value FunctionStabilityToValue(FunctionStability stability) {
	switch (stability) {
	case FunctionStability::VOLATILE:
		return Value("VOLATILE");
	case FunctionStability::CONSISTENT:
		return Value("CONSISTENT");
	case FunctionStability::CONSISTENT_WITHIN_QUERY:
		return Value("CONSISTENT_WITHIN_QUERY");
	default:
		throw InternalException("Unsupported FunctionStability");
	}
}